

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O3

void __thiscall
CMU462::Vertex::getNeighborhood
          (Vertex *this,
          map<std::_List_iterator<CMU462::Halfedge>,_double,_std::less<std::_List_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Halfedge>,_double>_>_>
          *seen,int depth)

{
  _Base_ptr p_Var1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  _Base_ptr *pp_Var5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  _List_iterator<CMU462::Halfedge> _Var8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  double dVar11;
  double dVar12;
  double dVar13;
  HalfedgeIter h;
  double dist;
  _List_iterator<CMU462::Halfedge> local_28;
  double local_20;
  
  if (depth < 0) {
    return;
  }
  local_28._M_node = (this->_halfedge)._M_node;
  p_Var7 = (seen->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var6 = &(seen->_M_t)._M_impl.super__Rb_tree_header._M_header;
  local_20 = INFINITY;
  _Var8._M_node = local_28._M_node;
  do {
    while (p_Var2 = _Var8._M_node[1]._M_prev, p_Var7 == (_Base_ptr)0x0) {
      _Var8._M_node = p_Var2[2]._M_next;
      if (local_28._M_node == _Var8._M_node) goto LAB_0017c73d;
    }
    p_Var3 = p_Var2[2]._M_prev;
    p_Var4 = p_Var3[0xf]._M_prev;
    p_Var10 = p_Var6;
    p_Var9 = p_Var7;
    do {
      if (*(_List_node_base **)(p_Var9 + 1) >= p_Var4) {
        p_Var10 = p_Var9;
      }
      p_Var9 = (&p_Var9->_M_left)[*(_List_node_base **)(p_Var9 + 1) < p_Var4];
    } while (p_Var9 != (_Base_ptr)0x0);
    if (((p_Var10 != p_Var6) && (*(_List_node_base **)(p_Var10 + 1) <= p_Var4)) &&
       (dVar11 = (double)p_Var3[1]._M_prev - (this->position).x,
       dVar12 = (double)p_Var3[2]._M_next - (this->position).y,
       dVar13 = (double)p_Var3[2]._M_prev - (this->position).z,
       dVar11 = SQRT(dVar13 * dVar13 + dVar11 * dVar11 + dVar12 * dVar12) +
                (double)p_Var10[1]._M_parent, dVar11 <= local_20)) {
      local_20 = dVar11;
    }
    _Var8._M_node = p_Var2[2]._M_next;
    p_Var9 = p_Var6;
    p_Var10 = p_Var7;
  } while (local_28._M_node != _Var8._M_node);
  do {
    p_Var1 = p_Var10 + 1;
    if (*(_List_node_base **)p_Var1 >= local_28._M_node) {
      p_Var9 = p_Var10;
    }
    pp_Var5 = &p_Var10->_M_left;
    p_Var10 = pp_Var5[*(_List_node_base **)p_Var1 < local_28._M_node];
  } while (pp_Var5[*(_List_node_base **)p_Var1 < local_28._M_node] != (_Base_ptr)0x0);
  if ((p_Var9 != p_Var6) &&
     (p_Var10 = p_Var6, *(_List_node_base **)(p_Var9 + 1) <= local_28._M_node)) {
    do {
      if (*(_List_node_base **)(p_Var7 + 1) >= local_28._M_node) {
        p_Var10 = p_Var7;
      }
      p_Var7 = (&p_Var7->_M_left)[*(_List_node_base **)(p_Var7 + 1) < local_28._M_node];
    } while (p_Var7 != (_Base_ptr)0x0);
    if ((p_Var10 != p_Var6) && (*(_List_node_base **)(p_Var10 + 1) <= local_28._M_node)) {
      p_Var6 = p_Var10;
    }
    if ((double)p_Var6[1]._M_parent <= local_20) goto LAB_0017c754;
  }
LAB_0017c73d:
  local_28._M_node = _Var8._M_node;
  std::
  _Rb_tree<std::_List_iterator<CMU462::Halfedge>,std::pair<std::_List_iterator<CMU462::Halfedge>const,double>,std::_Select1st<std::pair<std::_List_iterator<CMU462::Halfedge>const,double>>,std::less<std::_List_iterator<CMU462::Halfedge>>,std::allocator<std::pair<std::_List_iterator<CMU462::Halfedge>const,double>>>
  ::_M_emplace_unique<std::_List_iterator<CMU462::Halfedge>&,double&>
            ((_Rb_tree<std::_List_iterator<CMU462::Halfedge>,std::pair<std::_List_iterator<CMU462::Halfedge>const,double>,std::_Select1st<std::pair<std::_List_iterator<CMU462::Halfedge>const,double>>,std::less<std::_List_iterator<CMU462::Halfedge>>,std::allocator<std::pair<std::_List_iterator<CMU462::Halfedge>const,double>>>
              *)seen,&local_28,&local_20);
  local_28._M_node = (this->_halfedge)._M_node;
LAB_0017c754:
  do {
    getNeighborhood((Vertex *)(local_28._M_node[1]._M_prev[2]._M_prev + 1),seen,depth + -1);
    local_28._M_node = local_28._M_node[1]._M_prev[2]._M_next;
  } while ((this->_halfedge)._M_node != local_28._M_node);
  return;
}

Assistant:

void Vertex::getNeighborhood(map<HalfedgeIter, double>& seen, int depth) {
    if (depth < 0) return;

    HalfedgeIter h = _halfedge;
    double dist = INF_D;
    do {
      VertexIter u = h->twin()->vertex();
      auto d = seen.find(u->halfedge());
      if (d != seen.end()) {
        dist = std::min(d->second + (u->position - position).norm(), dist);
      }
      h = h->twin()->next();
    } while (h != _halfedge);

    if (seen.find(h) == seen.end() || seen.find(h)->second > dist) {
      seen.emplace(h, dist);
    }

    h = _halfedge;
    do {
      VertexIter u = h->twin()->vertex();
      u->getNeighborhood(seen, depth-1);
      h = h->twin()->next();
    } while (h != _halfedge);
  }